

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::SweepWeakReference(Recycler *this)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  Type *pTVar5;
  HeapBlock *pHVar6;
  RecyclerWeakReferenceRegionItem<void_*> *pRVar7;
  RecyclerWeakReferenceRegionItem<void_*> *pRVar8;
  RecyclerWeakReferenceRegionItem *this_00;
  undefined4 *puVar9;
  void *pvVar10;
  ulong uVar11;
  HeapBlock *block;
  RecyclerWeakReferenceRegionItem<void_*> *ref;
  size_t i;
  RecyclerWeakReferenceRegionItem<void_*> *refs;
  RecyclerWeakReferenceRegion region;
  EditingIterator edIt;
  byte local_11;
  Recycler *pRStack_10;
  bool hasCleanup;
  Recycler *this_local;
  
  local_11 = 0;
  pRStack_10 = this;
  WeakReferenceHashTable<PrimePolicy>::Map<Memory::Recycler::SweepWeakReference()::__0>
            (&this->weakReferenceMap,(anon_class_8_1_49ad6468)&local_11);
  SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::GetEditingIterator
            ((EditingIterator *)&region.arrayHeapBlock,&this->weakReferenceRegionList);
  do {
    while( true ) {
      bVar3 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
              EditingIterator::Next((EditingIterator *)&region.arrayHeapBlock);
      if (!bVar3) {
        this->weakReferenceCleanupId = (uint)(local_11 & 1) + this->weakReferenceCleanupId;
        return;
      }
      pTVar5 = SListBase<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::
               Iterator::Data((Iterator *)&region.arrayHeapBlock);
      refs = pTVar5->ptr;
      region.ptr = (Type)pTVar5->count;
      region.count = (Type)pTVar5->arrayHeapBlock;
      pHVar6 = RecyclerWeakReferenceRegion::GetHeapBlock((RecyclerWeakReferenceRegion *)&refs);
      pRVar7 = RecyclerWeakReferenceRegion::GetPtr((RecyclerWeakReferenceRegion *)&refs);
      uVar4 = (*pHVar6->_vptr_HeapBlock[0xb])(pHVar6,pRVar7);
      if ((uVar4 & 1) != 0) break;
      SList<Memory::RecyclerWeakReferenceRegion,_Memory::HeapAllocator,_RealCount>::EditingIterator
      ::RemoveCurrent((EditingIterator *)&region.arrayHeapBlock);
      local_11 = 1;
    }
    pRVar7 = RecyclerWeakReferenceRegion::GetPtr((RecyclerWeakReferenceRegion *)&refs);
    for (ref = (RecyclerWeakReferenceRegionItem<void_*> *)0x0;
        pRVar8 = (RecyclerWeakReferenceRegionItem<void_*> *)
                 RecyclerWeakReferenceRegion::GetCount((RecyclerWeakReferenceRegion *)&refs),
        ref < pRVar8; ref = ref + 1) {
      this_00 = (RecyclerWeakReferenceRegionItem *)(pRVar7 + (long)ref * 0x10);
      if (*(long *)this_00 != 0) {
        if ((*(ulong *)(this_00 + 8) & 1) == 1) {
          *(ulong *)(this_00 + 8) = *(ulong *)(this_00 + 8) & 0xfffffffffffffffe;
        }
        else {
          if (*(long *)(this_00 + 8) == 0) {
            pHVar6 = FindHeapBlock(this,*(void **)this_00);
            if (pHVar6 == (HeapBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                 ,0xcb0,"(false)",
                                 "WeakReferenceRegionItems should only contain recycler references")
              ;
              if (!bVar3) {
                pcVar2 = (code *)invalidInstructionException();
                (*pcVar2)();
              }
              puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar9 = 0;
              goto LAB_009a119f;
            }
            *(HeapBlock **)(this_00 + 8) = pHVar6;
          }
          plVar1 = *(long **)(this_00 + 8);
          pvVar10 = RecyclerWeakReferenceRegionItem::operator_cast_to_void_(this_00);
          uVar11 = (**(code **)(*plVar1 + 0x58))(plVar1,pvVar10);
          if ((uVar11 & 1) == 0) {
            *(undefined8 *)this_00 = 0;
            *(undefined8 *)(this_00 + 8) = 0;
            local_11 = 1;
          }
        }
      }
LAB_009a119f:
    }
  } while( true );
}

Assistant:

void
Recycler::SweepWeakReference()
{
    RECYCLER_PROFILE_EXEC_BEGIN(this, Js::SweepWeakPhase);
    GCETW(GC_SWEEP_WEAKREF_START, (this));

    // REVIEW: Clean up the weak reference map concurrently?
    bool hasCleanup = false;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint scannedCount = weakReferenceMap.Count();
#endif

    weakReferenceMap.Map([&hasCleanup](RecyclerWeakReferenceBase * weakRef) -> bool
    {
        if (!weakRef->weakRefHeapBlock->TestObjectMarkedBit(weakRef))
        {
            hasCleanup = true;

            // Remove
            return false;
        }

        if (!weakRef->strongRefHeapBlock->TestObjectMarkedBit(weakRef->strongRef))
        {
            hasCleanup = true;
            weakRef->strongRef = nullptr;

            // Put in a dummy heap block so that we can still do the isPendingConcurrentSweep check first.
            weakRef->strongRefHeapBlock = &CollectedRecyclerWeakRefHeapBlock::Instance;

            // Remove
            return false;
        }

        return true;
    });

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    uint regionScannedCount = 0;
    uint regionClearedCount = 0;
#endif

#if ENABLE_WEAK_REFERENCE_REGIONS

    auto edIt = this->weakReferenceRegionList.GetEditingIterator();
    while (edIt.Next())
    {
        RecyclerWeakReferenceRegion region = edIt.Data();
        // We want to see if user code has any reference to the region, if not, we can free the whole thing
        if (!region.GetHeapBlock()->TestObjectMarkedBit(region.GetPtr()))
        {
            edIt.RemoveCurrent();
            hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
            regionClearedCount += (uint)region.GetCount();
#endif
            continue;
        }

        // The region is referenced, clean up any stale weak references
        RecyclerWeakReferenceRegionItem<void*>* refs = region.GetPtr();
#if defined(GCETW) && defined(ENABLE_JS_ETW)
        regionScannedCount += (uint)region.GetCount();
#endif
        for (size_t i = 0; i < region.GetCount(); ++i)
        {
            RecyclerWeakReferenceRegionItem<void*> &ref = refs[i];
            if (ref.ptr == nullptr)
            {
                continue;
            }

            if (((uintptr_t)ref.heapBlock & 0x1) == 0x1)
            {
                // Background thread marked this ref. Unmark it, and keep it
                ref.heapBlock = (HeapBlock*)((uintptr_t)ref.heapBlock & ~0x1);
                continue;
            }

            if (ref.heapBlock == nullptr)
            {
                HeapBlock* block = this->FindHeapBlock(ref.ptr);
                if (block == nullptr)
                {
                    // This is not a real reference
                    AssertMsg(false, "WeakReferenceRegionItems should only contain recycler references");
                    continue;
                }
                else
                {
                    ref.heapBlock = block;
                }
            }

            if (!ref.heapBlock->TestObjectMarkedBit(ref))
            {
                ref.ptr = nullptr;
                ref.heapBlock = nullptr;
                hasCleanup = true;
#if defined(GCETW) && defined(ENABLE_JS_ETW)
                regionClearedCount++;
#endif
            }
        }
    }
#endif

    this->weakReferenceCleanupId += hasCleanup;

#if defined(GCETW) && defined(ENABLE_JS_ETW)
    const uint keptCount = weakReferenceMap.Count();
    GCETW(GC_SWEEP_WEAKREF_STOP_EX, (this, scannedCount, (scannedCount - keptCount), regionScannedCount, regionClearedCount));
#endif

    RECYCLER_PROFILE_EXEC_END(this, Js::SweepWeakPhase);
}